

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proj.c
# Opt level: O0

void project_normalcone(OSQPWorkspace *work,c_float *z,c_float *y)

{
  double *pdVar1;
  long lVar2;
  c_float local_40;
  c_float local_38;
  double local_30;
  c_int m;
  c_int i;
  c_float *y_local;
  c_float *z_local;
  OSQPWorkspace *work_local;
  
  lVar2 = work->data->m;
  for (i = 0; i < lVar2; i = i + 1) {
    work->z_prev[i] = z[i] + y[i];
    pdVar1 = work->data->l + i;
    if (work->z_prev[i] < *pdVar1 || work->z_prev[i] == *pdVar1) {
      local_30 = work->data->l[i];
    }
    else {
      local_30 = work->z_prev[i];
    }
    if (work->data->u[i] <= local_30) {
      local_40 = work->data->u[i];
    }
    else {
      pdVar1 = work->data->l + i;
      if (work->z_prev[i] < *pdVar1 || work->z_prev[i] == *pdVar1) {
        local_38 = work->data->l[i];
      }
      else {
        local_38 = work->z_prev[i];
      }
      local_40 = local_38;
    }
    z[i] = local_40;
    y[i] = work->z_prev[i] - z[i];
  }
  return;
}

Assistant:

void project_normalcone(OSQPWorkspace *work, c_float *z, c_float *y) {
  c_int i, m;

  // NB: Use z_prev as temporary vector

  m = work->data->m;

  for (i = 0; i < m; i++) {
    work->z_prev[i] = z[i] + y[i];
    z[i]            = c_min(c_max(work->z_prev[i], work->data->l[i]),
                            work->data->u[i]);
    y[i] = work->z_prev[i] - z[i];
  }
}